

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O2

void Cbs_ManStop(Cbs_Man_t *p)

{
  Vec_Ptr_t *__ptr;
  Gia_Obj_t **ppGVar1;
  
  Vec_IntFree(p->vLevReas);
  Vec_IntFree(p->vModel);
  __ptr = p->vTemp;
  free(__ptr->pArray);
  free(__ptr);
  ppGVar1 = (p->pClauses).pData;
  if (ppGVar1 != (Gia_Obj_t **)0x0) {
    free(ppGVar1);
    (p->pClauses).pData = (Gia_Obj_t **)0x0;
  }
  ppGVar1 = (p->pProp).pData;
  if (ppGVar1 != (Gia_Obj_t **)0x0) {
    free(ppGVar1);
    (p->pProp).pData = (Gia_Obj_t **)0x0;
  }
  free((p->pJust).pData);
  free(p);
  return;
}

Assistant:

void Cbs_ManStop( Cbs_Man_t * p )
{
    Vec_IntFree( p->vLevReas );
    Vec_IntFree( p->vModel );
    Vec_PtrFree( p->vTemp );
    ABC_FREE( p->pClauses.pData );
    ABC_FREE( p->pProp.pData );
    ABC_FREE( p->pJust.pData );
    ABC_FREE( p );
}